

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O2

void __thiscall mahjong::PatternComputer::~PatternComputer(PatternComputer *this)

{
  ~PatternComputer(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

void PatternComputer::compute(WiningPatterns& out_patterns, WiningHand& out_wining_hand)
{
	highest_patterns.clear();

	WiningHandCollator c;
	for (const auto& h : c.collate(hand))
	{
		resetRecognizer();

		check(h);

		const auto& patterns = recognize();
		setHighest(h, patterns);
	}

	special(hand);

	out_patterns = highest_patterns;
	out_wining_hand = highest_wining_hand;
}